

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BreakpointProbe.cpp
# Opt level: O0

bool __thiscall Js::BreakpointProbe::Uninstall(BreakpointProbe *this,ScriptContext *pScriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pScriptContext_local;
  BreakpointProbe *this_local;
  
  if (this->functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/BreakpointProbe.cpp"
                                ,0x1b,"(this->functionBody)","this->functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->functionBody == (FunctionBody *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    if (this->debugDocument == (DebugDocument *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/BreakpointProbe.cpp"
                                  ,0x1f,"(this->debugDocument)","this->debugDocument");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    DebugDocument::RemoveBreakpointProbe(this->debugDocument,this);
    this_local._7_1_ = FunctionBody::UninstallProbe(this->functionBody,this->byteOffset);
  }
  return this_local._7_1_;
}

Assistant:

bool BreakpointProbe::Uninstall(ScriptContext* pScriptContext)
    {
        Assert(this->functionBody);

        if (this->functionBody)
        {
            Assert(this->debugDocument);
            this->debugDocument->RemoveBreakpointProbe(this);

            return functionBody->UninstallProbe(byteOffset);
        }

        return true;
    }